

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void SendPreloadMsgs(CP_Services Svcs,Evpath_WSR_Stream WSR_Stream,TimestepList_conflict TS)

{
  undefined8 *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int i;
  _EvpathPreloadMsg PreloadMsg;
  Evpath_WS_Stream WS_Stream;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  undefined8 *local_18;
  long *local_10;
  undefined8 *local_8;
  
  local_20 = *in_RSI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*(code *)*in_RDI)(*(undefined8 *)(local_20 + 8),4,
                     "EVPATH Sending preload messages for timestep %ld\n",*in_RDX);
  memset(&local_48,0,0x28);
  local_48 = *local_18;
  local_40 = local_18[1];
  local_28 = local_18[2];
  local_38 = *(undefined4 *)(local_20 + 0x10);
  for (local_4c = 0; local_4c < (int)local_10[2]; local_4c = local_4c + 1) {
    if (*(char *)(local_10[4] + (long)local_4c) != '\0') {
      local_30 = *(undefined8 *)(local_10[6] + (long)local_4c * 0x18 + 0x10);
      (*(code *)*local_8)(*(undefined8 *)(local_20 + 8),5,
                          "EVPATH Preload message for timestep %ld, going to rank %d\n",*local_18,
                          local_4c);
      CMwrite(*(undefined8 *)(local_10[6] + (long)local_4c * 0x18 + 8),
              *(undefined8 *)(local_20 + 0x50),&local_48);
    }
  }
  return;
}

Assistant:

static void SendPreloadMsgs(CP_Services Svcs, Evpath_WSR_Stream WSR_Stream, TimestepList TS)
{
    Evpath_WS_Stream WS_Stream = WSR_Stream->WS_Stream; /* pointer to writer struct */
    struct _EvpathPreloadMsg PreloadMsg;
    Svcs->verbose(WS_Stream->CP_Stream, DPPerRankVerbose,
                  "EVPATH Sending preload messages for timestep %ld\n", TS->Timestep);
    memset(&PreloadMsg, 0, sizeof(PreloadMsg));
    PreloadMsg.Timestep = TS->Timestep;
    PreloadMsg.DataLength = TS->Data.DataSize;
    PreloadMsg.Data = TS->Data.block;
    PreloadMsg.WriterRank = WS_Stream->Rank;

    for (int i = 0; i < WSR_Stream->ReaderCohortSize; i++)
    {
        if (WSR_Stream->ReaderRequestArray[i])
        {
            PreloadMsg.RS_Stream = WSR_Stream->ReaderContactInfo[i].RS_Stream;
            Svcs->verbose(WS_Stream->CP_Stream, DPTraceVerbose,
                          "EVPATH Preload message for timestep %ld, going to rank %d\n",
                          TS->Timestep, i);
            CMwrite(WSR_Stream->ReaderContactInfo[i].Conn, WS_Stream->PreloadFormat, &PreloadMsg);
        }
    }
}